

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

ostream * __thiscall wasm::String::printEscapedJSON(String *this,ostream *os,string_view str)

{
  optional<unsigned_int> oVar1;
  ostream *poVar2;
  char *pcVar3;
  _Storage<unsigned_int,_true> codePoint;
  undefined1 local_48 [8];
  string_view str_local;
  anon_class_8_1_3fcf66a2 printEscape;
  
  str_local._M_len = str._M_len;
  local_48 = (undefined1  [8])os;
  std::operator<<((ostream *)this,'\"');
LAB_00c917eb:
  do {
    if (os == (ostream *)0x0) {
      poVar2 = std::operator<<((ostream *)this,'\"');
      return poVar2;
    }
    oVar1 = anon_unknown_0::takeWTF16CodePoint((string_view *)local_48,true);
    codePoint._M_value =
         oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    switch(codePoint._M_value) {
    case 8:
      pcVar3 = "\\b";
      break;
    case 9:
      pcVar3 = "\\t";
      break;
    case 10:
      pcVar3 = "\\n";
      break;
    case 0xb:
      goto switchD_00c91812_caseD_b;
    case 0xc:
      pcVar3 = "\\f";
      break;
    case 0xd:
      pcVar3 = "\\r";
      break;
    default:
      if (codePoint._M_value == 0x5c) {
        pcVar3 = "\\\\";
      }
      else {
        if (codePoint._M_value != 0x22) goto switchD_00c91812_caseD_b;
        pcVar3 = "\\\"";
      }
    }
    std::operator<<((ostream *)this,pcVar3);
    os = (ostream *)local_48;
  } while( true );
switchD_00c91812_caseD_b:
  if (codePoint._M_value - 0x20 < 0x5f) {
    std::operator<<((ostream *)this,
                    oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload._0_1_);
    os = (ostream *)local_48;
  }
  else {
    str_local._M_str = (char *)this;
    if (0xffff < codePoint._M_value) {
      if (0x10ffff < codePoint._M_value) {
        __assert_fail("u <= 0x10FFFF && \"unexpectedly high code point\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/string.cpp"
                      ,0x1a1,
                      "std::ostream &wasm::String::printEscapedJSON(std::ostream &, std::string_view)"
                     );
      }
      printEscapedJSON::anon_class_8_1_3fcf66a2::operator()
                ((anon_class_8_1_3fcf66a2 *)&str_local._M_str,
                 (codePoint._M_value - 0x10000 >> 10) + 0xd800);
      codePoint._M_value = codePoint._M_value & 0x3ff | 0xdc00;
    }
    printEscapedJSON::anon_class_8_1_3fcf66a2::operator()
              ((anon_class_8_1_3fcf66a2 *)&str_local._M_str,codePoint._M_value);
    os = (ostream *)local_48;
  }
  goto LAB_00c917eb;
}

Assistant:

std::ostream& printEscapedJSON(std::ostream& os, std::string_view str) {
  os << '"';
  while (str.size()) {
    auto u = *takeWTF16CodePoint(str);

    // Use escape sequences mandated by the JSON spec.
    switch (u) {
      case '"':
        os << "\\\"";
        continue;
      case '\\':
        os << "\\\\";
        continue;
      case '\b':
        os << "\\b";
        continue;
      case '\f':
        os << "\\f";
        continue;
      case '\n':
        os << "\\n";
        continue;
      case '\r':
        os << "\\r";
        continue;
      case '\t':
        os << "\\t";
        continue;
      default:
        break;
    }

    // TODO: To minimize size, consider additionally escaping only other control
    // characters (u <= 0x1F) and surrogates, emitting everything else directly
    // assuming a UTF-8 encoding of the JSON text. We don't do this now because
    // Print.cpp would consider the contents unprintable, messing up our test.
    bool isNaivelyPrintable = 32 <= u && u < 127;
    if (isNaivelyPrintable) {
      assert(u < 0x80 && "need additional logic to emit valid UTF-8");
      os << uint8_t(u);
      continue;
    }

    // Escape as '\uXXXX` for code points less than 0x10000 or as a
    // '\uXXXX\uYYYY' surrogate pair otherwise.
    auto printEscape = [&os](uint32_t codePoint) {
      assert(codePoint < 0x10000);
      os << std::hex << "\\u";
      os << ((codePoint & 0xF000) >> 12);
      os << ((codePoint & 0x0F00) >> 8);
      os << ((codePoint & 0x00F0) >> 4);
      os << (codePoint & 0x000F);
      os << std::dec;
    };
    if (u < 0x10000) {
      printEscape(u);
    } else {
      assert(u <= 0x10FFFF && "unexpectedly high code point");
      printEscape(0xD800 + ((u - 0x10000) >> 10));
      printEscape(0xDC00 + ((u - 0x10000) & 0x3FF));
    }
  }
  return os << '"';
}